

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_ReFire(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *self;
  FState *state;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004c6fc4;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_004c6f08:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004c6fc4;
        }
      }
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_004c6fb4;
          this = (DObject *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (this != (DObject *)0x0) {
              bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
              if (!bVar2) {
                __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_004c6fc4;
              }
            }
          }
          else if (this != (DObject *)0x0) goto LAB_004c6fb4;
        }
        if (2 < (uint)numparam) {
          VVar1 = param[2].field_0.field_3.Type;
          if ((VVar1 != 0xff) &&
             ((VVar1 != '\x03' ||
              ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))
             )) {
            __assertion = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
            ;
            goto LAB_004c6fc4;
          }
          if ((numparam != 3) && (VVar1 = param[3].field_0.field_3.Type, VVar1 != 0xff)) {
            if (VVar1 != '\x03') {
LAB_004c6fe5:
              __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x36c,
                            "int AF_A_ReFire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
            state = (FState *)param[3].field_0.field_1.a;
            if (param[3].field_0.field_1.atag == 7) goto LAB_004c6fa5;
            if (state != (FState *)0x0) goto LAB_004c6fe5;
          }
        }
      }
      state = (FState *)0x0;
LAB_004c6fa5:
      A_ReFire(self,state);
      return 0;
    }
    if (self == (AActor *)0x0) goto LAB_004c6f08;
  }
LAB_004c6fb4:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004c6fc4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x36b,"int AF_A_ReFire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AInventory, A_ReFire)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_STATE_OPT(state)	{ state = NULL; }
	A_ReFire(self, state);
	return 0;
}